

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamFtp::ParseUrl(BamFtp *this,string *url)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  string tempUrl;
  string filename;
  string hostname;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->m_isUrlParsed = false;
  pcVar1 = (url->_M_dataplus)._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + url->_M_string_length);
  local_68 = 0;
  local_60[0] = 0;
  local_70 = local_60;
  std::__cxx11::string::resize((ulong)&local_70,(char)local_a8);
  if (local_a8 != 0) {
    lVar3 = 0;
    do {
      iVar2 = tolower((int)(char)local_b0[lVar3]);
      local_70[lVar3] = (char)iVar2;
      lVar3 = lVar3 + 1;
    } while (local_a8 != lVar3);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  lVar3 = std::__cxx11::string::find((char *)&local_b0,FTP_PREFIX_abi_cxx11_,0);
  if (lVar3 != -1) {
    std::__cxx11::string::find((char)&local_b0,0x2f);
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b0);
    std::__cxx11::string::_M_assign((string *)&this->m_hostname);
    this->m_port = 0x15;
    std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_b0);
    if (local_88 != 0) {
      std::__cxx11::string::_M_assign((string *)&this->m_filename);
      this->m_isUrlParsed = true;
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

void BamFtp::ParseUrl(const std::string& url)
{

    // clear flag to start
    m_isUrlParsed = false;

    // make sure url starts with "ftp://", case-insensitive
    std::string tempUrl(url);
    toLower(tempUrl);
    const std::size_t prefixFound = tempUrl.find(FTP_PREFIX);
    if (prefixFound == std::string::npos) return;

    // find end of host name portion (first '/' hit after the prefix)
    const std::size_t firstSlashFound = tempUrl.find(HOST_SEPARATOR, FTP_PREFIX_LENGTH);
    if (firstSlashFound == std::string::npos) {
        ;  // no slash found... no filename given along with host?
    }

    // fetch hostname
    std::string hostname = tempUrl.substr(FTP_PREFIX_LENGTH, (firstSlashFound - FTP_PREFIX_LENGTH));
    m_hostname = hostname;
    m_port = FTP_PORT;

    // store remainder of URL as filename (must be non-empty)
    std::string filename = tempUrl.substr(firstSlashFound);
    if (filename.empty()) return;
    m_filename = filename;

    // set parsed OK flag
    m_isUrlParsed = true;
}